

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O2

bool __thiscall QJsonPrivate::Parser::parseObject(Parser *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  char cVar3;
  bool bVar4;
  bool bVar5;
  QCborContainerPrivate *pQVar6;
  iterator iVar7;
  iterator iVar8;
  reference source;
  reference source_00;
  reference target;
  reference target_00;
  QList<QtCbor::Element> *this_00;
  anon_union_8_2_4ee71171_for_Element_0 *this_01;
  long in_FS_OFFSET;
  anon_class_8_1_fd19d321 local_90;
  anon_class_8_1_bc016fc5_for__M_comp local_88;
  anon_class_8_1_bc016fc5_for__M_comp local_80;
  anon_union_8_2_4ee71171_for_Element_0 local_78;
  undefined8 uStack_70;
  anon_union_8_2_4ee71171_for_Element_0 local_68;
  undefined8 uStack_60;
  anon_union_8_2_4ee71171_for_Element_0 local_58;
  anon_union_8_2_4ee71171_for_Element_0 aStack_50;
  anon_union_8_2_4ee71171_for_Element_0 local_48;
  anon_union_8_2_4ee71171_for_Element_0 aStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->nestingLevel;
  this->nestingLevel = iVar1 + 1;
  if (iVar1 < 0x400) {
    cVar3 = nextToken(this);
    do {
      if (cVar3 != '\"') {
LAB_00114247:
        if (cVar3 != '}') {
          this->lastError = UnterminatedObject;
          goto LAB_001142f3;
        }
        this->nestingLevel = this->nestingLevel + -1;
        pQVar6 = (this->container).d.ptr;
        bVar4 = true;
        if (pQVar6 == (QCborContainerPrivate *)0x0) goto LAB_001142f5;
        this_00 = &pQVar6->elements;
        local_90.container = pQVar6;
        iVar7 = QList<QtCbor::Element>::begin(this_00);
        iVar8 = QList<QtCbor::Element>::end(this_00);
        if (iVar7.i != iVar8.i) {
          auVar2._8_8_ = (long)iVar8.i - (long)iVar7.i >> 0x3f;
          auVar2._0_8_ = (long)iVar8.i - (long)iVar7.i >> 4;
          local_48.container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          aStack_50.container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          std::
          _Temporary_buffer<QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>,_QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>::value_type>
          ::_Temporary_buffer((_Temporary_buffer<QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>,_QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>::value_type>
                               *)&local_58,
                              (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)
                              iVar7.i,(SUB168(auVar2 / SEXT816(2),0) + 1) / 2);
          if ((value_type *)local_48.value == (value_type *)0x0) {
            std::
            __inplace_stable_sort<QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>,__gnu_cxx::__ops::_Iter_comp_iter<sortContainer(QCborContainerPrivate*)::__0>>
                      ((ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar7.i,
                       (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar8.i,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_serialization_qjsonparser_cpp:418:17)>
                        )&local_90);
          }
          else {
            std::
            __stable_sort_adaptive<QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>,QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>::value_type*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<sortContainer(QCborContainerPrivate*)::__0>>
                      ((ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar7.i,
                       (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar8.i,
                       (value_type *)local_48.container,aStack_50.value,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_serialization_qjsonparser_cpp:418:17)>
                        )&local_90);
          }
          std::
          _Temporary_buffer<QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>,_QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>::value_type>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>,_QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>::value_type>
                      *)&local_58);
        }
        iVar7 = QList<QtCbor::Element>::begin(this_00);
        iVar8 = QList<QtCbor::Element>::end(this_00);
        local_88.compare = &local_90;
        local_80.compare = local_88.compare;
        if (iVar7.i == iVar8.i) goto LAB_0011444e;
        target_00.m_key = iVar7.i + 2;
        goto LAB_00114379;
      }
      if ((this->container).d.ptr == (QCborContainerPrivate *)0x0) {
        pQVar6 = (QCborContainerPrivate *)operator_new(0x40);
        (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i = 0;
        pQVar6->usedData = 0;
        (pQVar6->data).d.d = (Data *)0x0;
        (pQVar6->data).d.ptr = (char *)0x0;
        (pQVar6->data).d.size = 0;
        (pQVar6->elements).d.d = (Data *)0x0;
        (pQVar6->elements).d.ptr = (Element *)0x0;
        (pQVar6->elements).d.size = 0;
        QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->container,pQVar6);
      }
      bVar4 = parseMember(this);
      if (!bVar4) goto LAB_001142f3;
      cVar3 = nextToken(this);
      if (cVar3 != ',') goto LAB_00114247;
      cVar3 = nextToken(this);
    } while (cVar3 != '}');
    this->lastError = MissingObject;
  }
  else {
    this->lastError = DeepNesting;
  }
LAB_001142f3:
  bVar4 = false;
  goto LAB_001142f5;
  while( true ) {
    local_58 = target.m_key[-2].field_0;
    aStack_50 = *(anon_union_8_2_4ee71171_for_Element_0 *)&target.m_key[-2].type;
    local_48 = target.m_key[-1].field_0;
    aStack_40 = *(anon_union_8_2_4ee71171_for_Element_0 *)&target.m_key[-1].type;
    local_78 = (target.m_key)->field_0;
    uStack_70._0_4_ = (target.m_key)->type;
    uStack_70._4_4_ = (target.m_key)->flags;
    local_68 = target.m_key[1].field_0;
    uStack_60._0_4_ = target.m_key[1].type;
    uStack_60._4_4_ = target.m_key[1].flags;
    bVar5 = __gnu_cxx::__ops::
            _Iter_comp_iter<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/serialization/qjsonparser.cpp:422:17)>
            ::anon_class_8_1_bc016fc5_for__M_comp::operator()
                      (&local_80,(Value *)&local_58,(Value *)&local_78);
    target_00.m_key = target.m_key + 2;
    if (bVar5) break;
LAB_00114379:
    target.m_key = target_00.m_key;
    if (target.m_key == iVar8.i) goto LAB_0011444e;
  }
  this_01 = &target.m_key[-2].field_0;
  sortContainer::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this_01,target,source);
  for (; target_00.m_key != iVar8.i; target_00.m_key = target_00.m_key + 2) {
    local_58 = *this_01;
    aStack_50 = this_01[1];
    local_48 = this_01[2];
    aStack_40 = this_01[3];
    local_78 = (target_00.m_key)->field_0;
    uStack_70._0_4_ = (target_00.m_key)->type;
    uStack_70._4_4_ = (target_00.m_key)->flags;
    local_68 = target_00.m_key[1].field_0;
    uStack_60._0_4_ = target_00.m_key[1].type;
    uStack_60._4_4_ = target_00.m_key[1].flags;
    bVar5 = __gnu_cxx::__ops::
            _Iter_comp_iter<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/serialization/qjsonparser.cpp:422:17)>
            ::anon_class_8_1_bc016fc5_for__M_comp::operator()
                      (&local_88,(Value *)&local_58,(Value *)&local_78);
    this_01 = this_01 + (ulong)!bVar5 * 4;
    sortContainer::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)this_01,target_00,source_00);
  }
  iVar8.i = (Element *)(this_01 + 4);
LAB_0011444e:
  iVar7 = QList<QtCbor::Element>::end(this_00);
  QList<QtCbor::Element>::erase(this_00,(const_iterator)iVar8.i,(const_iterator)iVar7.i);
LAB_001142f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseObject()
{
    if (++nestingLevel > nestingLimit) {
        lastError = QJsonParseError::DeepNesting;
        return false;
    }

    char token = nextToken();
    while (token == Quote) {
        if (!container)
            container = new QCborContainerPrivate;
        if (!parseMember())
            return false;
        token = nextToken();
        if (token != ValueSeparator)
            break;
        token = nextToken();
        if (token == EndObject) {
            lastError = QJsonParseError::MissingObject;
            return false;
        }
    }

    if (token != EndObject) {
        lastError = QJsonParseError::UnterminatedObject;
        return false;
    }

    --nestingLevel;

    if (container)
        sortContainer(container.data());
    return true;
}